

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

RDL_cycleIterator * RDL_getRCyclesForRCFIterator(RDL_data *data,uint index)

{
  uint uVar1;
  uint rcf_index;
  uint bcc_index_00;
  uint bcc_index;
  uint urf_index;
  uint urf_internal_index;
  uint rcf_internal_index;
  RDL_cycleIterator *it;
  uint index_local;
  RDL_data *data_local;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    data_local = (RDL_data *)0x0;
  }
  else if (index < data->nofRCFs) {
    uVar1 = data->rcf_to_urf[index][0];
    rcf_index = data->rcf_to_urf[index][1];
    bcc_index_00 = data->urf_to_bcc[uVar1][0];
    uVar1 = data->urf_to_bcc[uVar1][1];
    data_local = (RDL_data *)
                 RDL_initCycleIterator
                           (RDL_RCF_IT,rcf_index,rcf_index,uVar1,uVar1,bcc_index_00,bcc_index_00,'b'
                            ,data);
  }
  else {
    (*RDL_outputFunc)(RDL_ERROR,"invalid index: %u\n",(ulong)index);
    data_local = (RDL_data *)0x0;
  }
  return (RDL_cycleIterator *)data_local;
}

Assistant:

RDL_cycleIterator* RDL_getRCyclesForRCFIterator(const RDL_data *data, unsigned index)
{
  RDL_cycleIterator* it;
  unsigned rcf_internal_index, urf_internal_index, urf_index;
  unsigned bcc_index;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    return NULL;
  }

  if (index >= data->nofRCFs) {
    RDL_outputFunc(RDL_ERROR, "invalid index: %u\n", index);
    return NULL;
  }

  urf_index = data->rcf_to_urf[index][0];
  rcf_internal_index = data->rcf_to_urf[index][1];
  bcc_index = data->urf_to_bcc[urf_index][0];
  urf_internal_index = data->urf_to_bcc[urf_index][1];

  it = RDL_initCycleIterator(RDL_RCF_IT,
      rcf_internal_index, rcf_internal_index,
      urf_internal_index, urf_internal_index,
      bcc_index, bcc_index,
      'b', data);

  return it;
}